

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O0

void gauden_accum_param_full
               (vector_t ****out,vector_t ****in,uint32 n_mgau,uint32 n_feat,uint32 n_density,
               uint32 *veclen)

{
  uint local_44;
  uint local_40;
  uint32 ll;
  uint32 l;
  uint32 k;
  uint32 j;
  uint32 i;
  uint32 *veclen_local;
  uint32 n_density_local;
  uint32 n_feat_local;
  uint32 n_mgau_local;
  vector_t ****in_local;
  vector_t ****out_local;
  
  for (k = 0; k < n_mgau; k = k + 1) {
    for (l = 0; l < n_feat; l = l + 1) {
      for (ll = 0; ll < n_density; ll = ll + 1) {
        for (local_40 = 0; local_40 < veclen[l]; local_40 = local_40 + 1) {
          for (local_44 = 0; local_44 < veclen[l]; local_44 = local_44 + 1) {
            out[k][l][ll][local_40][local_44] =
                 in[k][l][ll][local_40][local_44] + out[k][l][ll][local_40][local_44];
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
gauden_accum_param_full(vector_t ****out,
			vector_t ****in,
			uint32 n_mgau,
			uint32 n_feat,
			uint32 n_density,
			const uint32 *veclen)
{
    uint32 i, j, k, l, ll;

    for (i = 0; i < n_mgau; i++) {
	for (j = 0; j < n_feat; j++) {
	    for (k = 0; k < n_density; k++) {
		for (l = 0; l < veclen[j]; l++) {
		    for (ll = 0; ll < veclen[j]; ll++) {
			out[i][j][k][l][ll] += in[i][j][k][l][ll];
		    }
		}
	    }
	}
    }
}